

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int vs_se(bitstream *str,int32_t *val)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint32_t tmp;
  uint local_c;
  
  if (str->dir == VS_ENCODE) {
    iVar2 = *val;
    local_c = iVar2 * 2 - 1;
    if (iVar2 < 1) {
      local_c = iVar2 * -2;
    }
    iVar2 = vs_ue(str,&local_c);
  }
  else {
    iVar1 = vs_ue(str,&local_c);
    iVar2 = 1;
    if (iVar1 == 0) {
      uVar3 = local_c + 1 >> 1;
      if ((local_c & 1) == 0) {
        uVar3 = -(local_c >> 1);
      }
      *val = uVar3;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int vs_se(struct bitstream *str, int32_t *val) {
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		if (*val == (int32_t)(-0x7fffffff-1)) {
			fprintf (stderr, "Exp-Golomb signed number equal to -2^31\n");
			return 1;
		}
		if (*val > 0) {
			tmp = *val * 2 - 1;
		} else {
			tmp = -*val * 2;
		}
		return vs_ue(str, &tmp);
	} else {
		if (vs_ue(str, &tmp))
			return 1;
		if (tmp & 1) {
			*val = (tmp + 1) >> 1;
		} else {
			*val = -(tmp >> 1);
		}
		return 0;
	}
}